

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

int float64_is_signaling_nan_mips64(float64 a_,float_status *status)

{
  uint64_t a;
  bool bVar1;
  
  if (status->snan_bit_is_one == '\0') {
    bVar1 = (a_ & 0x7ffffffffffff) != 0 && (a_ & 0x7ff8000000000000) == 0x7ff0000000000000;
  }
  else {
    bVar1 = 0xffe < ((uint)(a_ >> 0x33) & 0xfff);
  }
  return (int)bVar1;
}

Assistant:

int float64_is_signaling_nan(float64 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    uint64_t a = float64_val(a_);
    if (snan_bit_is_one(status)) {
        return ((a << 1) >= 0xFFF0000000000000ULL);
    } else {
        return (((a >> 51) & 0xFFF) == 0xFFE)
            && (a & UINT64_C(0x0007FFFFFFFFFFFF));
    }
#endif
}